

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O2

int run_test(test *test)

{
  int iVar1;
  char *__format;
  
  printf("Running %-10s %-36s \x1b[0;90m...\x1b[0;0m ",test->suite,test->name);
  fflush(_stdout);
  iVar1 = (*test->fun)();
  __format = "\x1b[0;32m[OK  ]";
  if (iVar1 == 0) {
    __format = "\x1b[1;31m[FAIL]";
  }
  printf(__format);
  puts("\x1b[0;0m");
  return iVar1;
}

Assistant:

int run_test(struct test *test){
  printf("Running %-10s %-36s \033[0;90m...\033[0;0m ", test->suite, test->name);
  fflush(stdout);
  int result = test->fun();
  printf((result==0)?"\033[1;31m[FAIL]":"\033[0;32m[OK  ]");
  printf("\033[0;0m\n");
  return result;
}